

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::convert_arg_for_ini
                   (string *__return_storage_ptr__,string *arg,char stringQuote,char literalQuote,
                   bool disable_multi_line)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  byte *pbVar7;
  char *pcVar8;
  allocator local_219;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  allocator local_1b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  allocator local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined8 local_120;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  char *local_110;
  undefined8 local_100;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  char *local_f0;
  undefined8 local_e0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  char *local_d0;
  allocator local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  double local_38;
  double val;
  allocator local_1c;
  byte local_1b;
  char local_1a;
  char local_19;
  bool disable_multi_line_local;
  char literalQuote_local;
  string *psStack_18;
  char stringQuote_local;
  string *arg_local;
  
  local_1b = disable_multi_line;
  local_1a = literalQuote;
  local_19 = stringQuote;
  psStack_18 = arg;
  arg_local = __return_storage_ptr__;
  uVar5 = ::std::__cxx11::string::empty();
  cVar1 = local_19;
  if ((uVar5 & 1) == 0) {
    bVar3 = ::std::operator==(psStack_18,"true");
    if ((((bVar3) || (bVar3 = ::std::operator==(psStack_18,"false"), bVar3)) ||
        (bVar3 = ::std::operator==(psStack_18,"nan"), bVar3)) ||
       (bVar3 = ::std::operator==(psStack_18,"inf"), bVar3)) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psStack_18);
    }
    else {
      iVar4 = ::std::__cxx11::string::compare((ulong)psStack_18,0,(char *)0x2);
      if ((iVar4 != 0) &&
         (iVar4 = ::std::__cxx11::string::compare((ulong)psStack_18,0,(char *)0x2), iVar4 != 0)) {
        local_38 = 0.0;
        bVar3 = lexical_cast<double,_(CLI::detail::enabler)0>(psStack_18,&local_38);
        if ((bVar3) &&
           (lVar6 = ::std::__cxx11::string::find_first_not_of((char *)psStack_18,0x1b9c66),
           lVar6 == -1)) {
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psStack_18);
          return __return_storage_ptr__;
        }
      }
      lVar6 = ::std::__cxx11::string::size();
      if (lVar6 == 1) {
        pbVar7 = (byte *)::std::__cxx11::string::front();
        iVar4 = isprint((uint)*pbVar7);
        if (iVar4 == 0) {
          binary_escape_string(__return_storage_ptr__,psStack_18);
        }
        else {
          bVar3 = ::std::operator==(psStack_18,"\'");
          cVar2 = local_19;
          cVar1 = local_1a;
          if (bVar3) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_78,1,cVar2,&local_79);
            ::std::operator+(&local_58,&local_78,"\'");
            ::std::operator+(__return_storage_ptr__,&local_58,local_19);
            ::std::__cxx11::string::~string((string *)&local_58);
            ::std::__cxx11::string::~string((string *)&local_78);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
          }
          else {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_c0,1,cVar1,&local_c1);
            ::std::operator+(&local_a0,&local_c0,psStack_18);
            ::std::operator+(__return_storage_ptr__,&local_a0,local_1a);
            ::std::__cxx11::string::~string((string *)&local_a0);
            ::std::__cxx11::string::~string((string *)&local_c0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_c1);
          }
        }
      }
      else {
        pcVar8 = (char *)::std::__cxx11::string::front();
        if (*pcVar8 == '0') {
          pcVar8 = (char *)::std::__cxx11::string::operator[]((ulong)psStack_18);
          if (*pcVar8 == 'x') {
            local_d8._M_current = (char *)::std::__cxx11::string::begin();
            local_d0 = (char *)__gnu_cxx::
                               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ::operator+(&local_d8,2);
            local_e0 = ::std::__cxx11::string::end();
            bVar3 = ::std::
                    all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_1_>
                              (local_d0,local_e0);
            if (bVar3) {
              ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psStack_18);
              return __return_storage_ptr__;
            }
          }
          else {
            pcVar8 = (char *)::std::__cxx11::string::operator[]((ulong)psStack_18);
            if (*pcVar8 == 'o') {
              local_f8._M_current = (char *)::std::__cxx11::string::begin();
              local_f0 = (char *)__gnu_cxx::
                                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ::operator+(&local_f8,2);
              local_100 = ::std::__cxx11::string::end();
              bVar3 = ::std::
                      all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_2_>
                                (local_f0,local_100);
              if (bVar3) {
                ::std::__cxx11::string::string
                          ((string *)__return_storage_ptr__,(string *)psStack_18);
                return __return_storage_ptr__;
              }
            }
            else {
              pcVar8 = (char *)::std::__cxx11::string::operator[]((ulong)psStack_18);
              if (*pcVar8 == 'b') {
                local_118._M_current = (char *)::std::__cxx11::string::begin();
                local_110 = (char *)__gnu_cxx::
                                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator+(&local_118,2);
                local_120 = ::std::__cxx11::string::end();
                bVar3 = ::std::
                        all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_3_>
                                  (local_110,local_120);
                if (bVar3) {
                  ::std::__cxx11::string::string
                            ((string *)__return_storage_ptr__,(string *)psStack_18);
                  return __return_storage_ptr__;
                }
              }
            }
          }
        }
        bVar3 = is_printable(psStack_18);
        if (bVar3) {
          bVar3 = has_escapable_character(psStack_18);
          cVar1 = local_19;
          if (bVar3) {
            uVar5 = ::std::__cxx11::string::size();
            cVar1 = local_19;
            if ((uVar5 < 0x65) || ((local_1b & 1) != 0)) {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)&local_1b0,1,cVar1,&local_1b1);
              add_escaped_characters(&local_1d8,psStack_18);
              ::std::operator+(&local_190,&local_1b0,&local_1d8);
              ::std::operator+(__return_storage_ptr__,&local_190,local_19);
              ::std::__cxx11::string::~string((string *)&local_190);
              ::std::__cxx11::string::~string((string *)&local_1d8);
              ::std::__cxx11::string::~string((string *)&local_1b0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
            }
            else {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)&local_168,"\'\'\'",&local_169);
              ::std::operator+(&local_148,&local_168,psStack_18);
              ::std::operator+(__return_storage_ptr__,&local_148,"\'\'\'");
              ::std::__cxx11::string::~string((string *)&local_148);
              ::std::__cxx11::string::~string((string *)&local_168);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_169);
            }
          }
          else {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_218,1,cVar1,&local_219);
            ::std::operator+(&local_1f8,&local_218,psStack_18);
            ::std::operator+(__return_storage_ptr__,&local_1f8,local_19);
            ::std::__cxx11::string::~string((string *)&local_1f8);
            ::std::__cxx11::string::~string((string *)&local_218);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_219);
          }
        }
        else {
          binary_escape_string(__return_storage_ptr__,psStack_18);
        }
      }
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,2,cVar1,&local_1c);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1c);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string
convert_arg_for_ini(const std::string &arg, char stringQuote, char literalQuote, bool disable_multi_line) {
    if(arg.empty()) {
        return std::string(2, stringQuote);
    }
    // some specifically supported strings
    if(arg == "true" || arg == "false" || arg == "nan" || arg == "inf") {
        return arg;
    }
    // floating point conversion can convert some hex codes, but don't try that here
    if(arg.compare(0, 2, "0x") != 0 && arg.compare(0, 2, "0X") != 0) {
        using CLI::detail::lexical_cast;
        double val = 0.0;
        if(lexical_cast(arg, val)) {
            if(arg.find_first_not_of("0123456789.-+eE") == std::string::npos) {
                return arg;
            }
        }
    }
    // just quote a single non numeric character
    if(arg.size() == 1) {
        if(isprint(static_cast<unsigned char>(arg.front())) == 0) {
            return binary_escape_string(arg);
        }
        if(arg == "'") {
            return std::string(1, stringQuote) + "'" + stringQuote;
        }
        return std::string(1, literalQuote) + arg + literalQuote;
    }
    // handle hex, binary or octal arguments
    if(arg.front() == '0') {
        if(arg[1] == 'x') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) {
                   return (x >= '0' && x <= '9') || (x >= 'A' && x <= 'F') || (x >= 'a' && x <= 'f');
               })) {
                return arg;
            }
        } else if(arg[1] == 'o') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x >= '0' && x <= '7'); })) {
                return arg;
            }
        } else if(arg[1] == 'b') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x == '0' || x == '1'); })) {
                return arg;
            }
        }
    }
    if(!is_printable(arg)) {
        return binary_escape_string(arg);
    }
    if(detail::has_escapable_character(arg)) {
        if(arg.size() > 100 && !disable_multi_line) {
            return std::string(multiline_literal_quote) + arg + multiline_literal_quote;
        }
        return std::string(1, stringQuote) + detail::add_escaped_characters(arg) + stringQuote;
    }
    return std::string(1, stringQuote) + arg + stringQuote;
}